

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<kj::StringTree,char_const*,kj::StringPtr&,char,kj::StringTree,char>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char **params_1,
          StringPtr *params_2,char *params_3,StringTree *params_4,char *params_5)

{
  char *__s;
  FixedArray<char,_1UL> *in_stack_ffffffffffffffa0;
  undefined1 local_52;
  undefined1 local_51 [9];
  char *local_48;
  char *local_40;
  char *local_38;
  
  __s = (char *)params->size_;
  local_38 = (char *)strlen(__s);
  local_51._1_8_ = *params_1;
  local_48 = params_1[1] + -1;
  local_51[0] = *(undefined1 *)&(params_2->content).ptr;
  local_52 = (undefined1)params_4->size_;
  local_40 = __s;
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)this,(StringTree *)&local_40,
             (ArrayPtr<const_char> *)(local_51 + 1),(ArrayPtr<const_char> *)local_51,
             (FixedArray<char,_1UL> *)params_3,(StringTree *)&local_52,in_stack_ffffffffffffffa0);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}